

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O3

double sdf::SDF(Vector3d *location,
               vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  double dVar1;
  double dVar2;
  operation_t oVar3;
  Primitive *pPVar4;
  pointer ppPVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar6;
  double extraout_XMM0_Qa_02;
  SrcEvaluatorType srcEvaluator;
  Vector3d location_warped;
  Transform<double,_3,_2,_0> res;
  double local_130;
  assign_op<double,_double> local_121;
  Vector3d *local_120;
  undefined1 local_118 [16];
  Matrix<double,_4,_4,_0,_4,_4> *local_108;
  variable_if_dynamic<long,__1> local_100;
  variable_if_dynamic<long,__1> vStack_f8;
  Index local_f0;
  undefined1 local_e8 [16];
  Affine3d *local_d8;
  variable_if_dynamic<long,__1> vStack_d0;
  variable_if_dynamic<long,__1> vStack_c8;
  Index local_c0;
  Matrix<double,_4,_4,_0,_4,_4> local_b8;
  
  ppPVar5 = (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar5 ==
      (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_130 = 0.0;
  }
  else {
    local_130 = 0.0;
    local_120 = location;
    do {
      pPVar4 = *ppPVar5;
      local_e8._0_8_ = &pPVar4->transformation;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      vStack_d0.m_value = 0;
      vStack_c8.m_value = 0;
      local_c0 = 4;
      local_118._0_8_ = &local_b8;
      local_100.m_value = 0;
      vStack_f8.m_value = 0;
      local_f0 = 4;
      local_108 = (Matrix<double,_4,_4,_0,_4,_4> *)local_118._0_8_;
      local_d8 = (Affine3d *)local_e8._0_8_;
      Eigen::internal::
      Assignment<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false>,_Eigen::Inverse<Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> *)local_118,
            (SrcXprType *)local_e8,&local_121);
      dVar6 = (pPVar4->transformation).m_matrix.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
              [0xc];
      dVar1 = (pPVar4->transformation).m_matrix.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
              [0xd];
      dVar2 = (pPVar4->transformation).m_matrix.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
              [0xe];
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = (dVar6 * -local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0] -
              dVar1 * local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[4]) -
              dVar2 * local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[8];
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = (dVar6 * -local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1] -
              dVar1 * local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[5]) -
              dVar2 * local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[9];
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = (-local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[10] * dVar2 -
              dVar1 * local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[6]) -
              dVar6 * local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2];
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      local_e8._0_8_ =
           (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[0];
      local_e8._8_8_ =
           (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1];
      local_d8 = (Affine3d *)
                 (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[2];
      vStack_d0.m_value = 0x3ff0000000000000;
      local_118._0_8_ =
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xc] * 1.0 +
           (double)local_d8 *
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[8] +
           (double)local_e8._8_8_ *
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[4] +
           (double)local_e8._0_8_ *
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0];
      local_118._8_8_ =
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] * 1.0 +
           (double)local_d8 *
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[9] +
           (double)local_e8._8_8_ *
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[5] +
           (double)local_e8._0_8_ *
           local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[1];
      local_108 = (Matrix<double,_4,_4,_0,_4,_4> *)
                  (local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0xe] * 1.0 +
                  (double)local_e8._8_8_ *
                  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[6] +
                  (double)local_e8._0_8_ *
                  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[2] +
                  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[10] * (double)local_d8);
      pPVar4 = *ppPVar5;
      if (ppPVar5 ==
          (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        (**pPVar4->_vptr_Primitive)
                  (pPVar4,(Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> *)local_118);
        local_130 = extraout_XMM0_Qa_00;
      }
      else {
        oVar3 = pPVar4->operation;
        if (oVar3 == bool_intersection) {
          (**pPVar4->_vptr_Primitive)(pPVar4,local_118);
          dVar6 = extraout_XMM0_Qa_02;
        }
        else {
          if (oVar3 != bool_subtraction) {
            if ((oVar3 == bool_union) &&
               ((**pPVar4->_vptr_Primitive)(pPVar4,local_118), extraout_XMM0_Qa <= local_130)) {
              local_130 = extraout_XMM0_Qa;
            }
            goto LAB_00104572;
          }
          (**pPVar4->_vptr_Primitive)(pPVar4,local_118);
          dVar6 = -extraout_XMM0_Qa_01;
        }
        if (local_130 <= dVar6) {
          local_130 = dVar6;
        }
      }
LAB_00104572:
      ppPVar5 = ppPVar5 + 1;
    } while (ppPVar5 !=
             (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return local_130;
}

Assistant:

double 
  SDF(const Eigen::Vector3d &location, const std::vector<Primitive*> &primitives)
  {
    double d_value = 0.0;

    for(std::vector<Primitive*>::const_iterator it = primitives.begin(); it != primitives.end(); ++it)
    {
      Eigen::Vector3d location_warped = it[0]->transformation.inverse()*location;
      if( it == primitives.begin() ) d_value = it[0]->signedDistance(location_warped);
      else
      {
        switch(it[0]->operation)
        {
          case bool_union :
            d_value = std::min( it[0]->signedDistance(location_warped), d_value);
          
            break;
          case bool_intersection :
            d_value = std::max( it[0]->signedDistance(location_warped), d_value);
            break;
          
          case bool_subtraction :
            d_value = std::max( -it[0]->signedDistance(location_warped), d_value);
            break;
        } 
      }
    }
    return d_value;
  }